

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_band.c
# Opt level: O0

int SUNMatZero_Band(SUNMatrix A)

{
  long lVar1;
  SUNMatrix_ID SVar2;
  long *in_RDI;
  realtype *Adata;
  sunindextype i;
  SUNMatrix in_stack_ffffffffffffffe0;
  undefined4 local_14;
  undefined4 local_4;
  
  SVar2 = SUNMatGetID(in_stack_ffffffffffffffe0);
  if (SVar2 == SUNMATRIX_BAND) {
    lVar1 = *(long *)(*in_RDI + 0x18);
    for (local_14 = 0; local_14 < *(int *)(*in_RDI + 0x20); local_14 = local_14 + 1) {
      *(undefined8 *)(lVar1 + (long)local_14 * 8) = 0;
    }
    local_4 = 0;
  }
  else {
    local_4 = -0x2bd;
  }
  return local_4;
}

Assistant:

int SUNMatZero_Band(SUNMatrix A)
{
  sunindextype i;
  realtype *Adata;

  /* Verify that A is a band matrix */
  if (SUNMatGetID(A) != SUNMATRIX_BAND)
    return SUNMAT_ILL_INPUT;

  /* Perform operation */
  Adata = SM_DATA_B(A);
  for (i=0; i<SM_LDATA_B(A); i++)
    Adata[i] = ZERO;
  return SUNMAT_SUCCESS;
}